

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O1

void dec_derive_skip_mv_umve(com_core_t *core,int umve_idx)

{
  com_scu_t *pcVar1;
  s16 (*paasVar2) [2] [2];
  s8 (*pasVar3) [2];
  uint uVar4;
  int iVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  undefined4 in_register_00000034;
  int iVar9;
  char cVar10;
  s16 sVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  s16 pmv_base_cands [2] [2];
  int neighbor [5];
  undefined2 local_82;
  s16 local_80 [2];
  s16 local_7c [2];
  uint local_78 [4];
  uint local_68;
  long local_60;
  int local_58 [4];
  int local_48;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,umve_idx);
  iVar9 = core->cu_scup;
  iVar12 = core->seqhdr->i_scu;
  pcVar1 = (core->map).map_scu;
  paasVar2 = (core->map).map_mv;
  pasVar3 = (core->map).map_refi;
  iVar5 = 1;
  if (umve_idx / 0x14 < 1) {
    iVar5 = umve_idx / 0x14;
  }
  local_82 = -1;
  local_58[3] = iVar9 + -1;
  local_58[0] = ((core->cu_height >> 2) + -1) * iVar12 + iVar9 + -1;
  iVar9 = iVar9 - iVar12;
  local_58[2] = (core->cu_width >> 2) + iVar9;
  local_58[1] = local_58[2] + -1;
  local_60 = (long)iVar9;
  local_48 = iVar9 + -1;
  local_78[0] = (byte)pcVar1[local_58[0]] >> 2 & 1;
  local_78[1] = (byte)pcVar1[(long)local_58[2] + -1] >> 2 & 1;
  local_78[2] = (byte)pcVar1[local_58[2]] >> 2 & 1;
  local_78[3] = (byte)pcVar1[local_58[3]] >> 2 & 1;
  local_68 = (byte)pcVar1[local_60 + -1] >> 2 & 1;
  cVar10 = (char)local_78[1];
  if ((((byte)pcVar1[local_58[0]] >> 2 & 1) != 0) && (cVar10 != '\0')) {
    local_78[1] = 1;
    if ((pasVar3[(long)local_58[2] + -1] == pasVar3[local_58[0]]) &&
       ((pasVar3[(long)local_58[2] + -1][0] == -1 ||
        (paasVar2[(long)local_58[2] + -1][0] == paasVar2[local_58[0]][0])))) {
      if (pasVar3[(long)local_58[2] + -1][1] == -1) {
        local_78[1] = 0;
      }
      else {
        local_78[1] = (uint)(paasVar2[(long)local_58[2] + -1][1] != paasVar2[local_58[0]][1]);
      }
    }
  }
  if ((cVar10 != '\0') && ((char)local_78[2] != '\0')) {
    local_78[2] = 1;
    if ((pasVar3[(long)local_58[2] + -1] == pasVar3[local_58[2]]) &&
       ((pasVar3[(long)local_58[2] + -1][0] == -1 ||
        (paasVar2[(long)local_58[2] + -1][0] == paasVar2[local_58[2]][0])))) {
      if (pasVar3[(long)local_58[2] + -1][1] == -1) {
        local_78[2] = 0;
      }
      else {
        local_78[2] = (uint)(paasVar2[(long)local_58[2] + -1][1] != paasVar2[local_58[2]][1]);
      }
    }
  }
  cVar6 = (char)local_78[3];
  if (((char)local_78[0] != '\0') && (cVar6 != '\0')) {
    local_78[3] = 1;
    if ((pasVar3[local_58[3]] == pasVar3[local_58[0]]) &&
       ((pasVar3[local_58[3]][0] == -1 || (paasVar2[local_58[3]][0] == paasVar2[local_58[0]][0]))))
    {
      if (pasVar3[local_58[3]][1] == -1) {
        local_78[3] = 0;
      }
      else {
        local_78[3] = (uint)(paasVar2[local_58[3]][1] != paasVar2[local_58[0]][1]);
      }
    }
  }
  if ((char)local_68 != '\0') {
    if (cVar6 == '\0') {
      if (cVar10 != '\0') goto LAB_0010a0a7;
      bVar20 = true;
    }
    else {
      if ((pasVar3[local_60 + -1] == pasVar3[local_58[3]]) &&
         ((pasVar3[local_60 + -1][0] == -1 ||
          (paasVar2[local_60 + -1][0] == paasVar2[local_58[3]][0])))) {
        if (pasVar3[local_60 + -1][1] == -1) {
          bVar19 = true;
        }
        else {
          bVar19 = paasVar2[local_60 + -1][1] == paasVar2[local_58[3]][1];
        }
      }
      else {
        bVar19 = false;
      }
      bVar20 = (bool)(bVar19 ^ 1);
      if ((bVar19 == false) && (cVar10 != '\0')) {
LAB_0010a0a7:
        bVar20 = true;
        if ((pasVar3[local_60 + -1] == pasVar3[(long)local_58[2] + -1]) &&
           ((pasVar3[local_60 + -1][0] == -1 ||
            (paasVar2[local_60 + -1][0] == paasVar2[(long)local_58[2] + -1][0])))) {
          if (pasVar3[local_60 + -1][1] == -1) {
            bVar20 = false;
          }
          else {
            bVar20 = paasVar2[local_60 + -1][1] != paasVar2[(long)local_58[2] + -1][1];
          }
        }
      }
    }
    local_68 = (uint)bVar20;
  }
  iVar9 = 0;
  bVar20 = -0x14 < umve_idx;
  if (-0x14 < umve_idx) {
    local_82._0_1_ = -1;
    local_82._1_1_ = -1;
    uVar13 = 0;
    iVar9 = 0;
    do {
      if (local_78[uVar13] != 0) {
        if (iVar9 == iVar5) {
          iVar12 = local_58[uVar13];
          if (-1 < pasVar3[iVar12][0]) {
            local_80 = paasVar2[iVar12][0];
            local_82._0_1_ = pasVar3[iVar12][0];
          }
          if (-1 < pasVar3[iVar12][1]) {
            local_7c = paasVar2[iVar12][1];
            local_82._1_1_ = pasVar3[iVar12][1];
          }
        }
        iVar9 = iVar9 + 1;
      }
      bVar20 = iVar9 <= iVar5;
    } while ((uVar13 < 4) && (uVar13 = uVar13 + 1, iVar9 <= iVar5));
  }
  uVar16 = umve_idx % 0x14;
  if (bVar20) {
    if (iVar9 != iVar5) {
      iVar9 = iVar9 + 1;
      goto LAB_0010a19a;
    }
    derive_temporal_motions(core,&local_80,(s8 *)&local_82);
  }
  else {
LAB_0010a19a:
    if (iVar9 <= iVar5) {
      local_82 = -0x100;
      local_80[0] = 0;
      local_80[1] = 0;
    }
  }
  uVar18 = uVar16 + 3;
  if (-1 < (int)uVar16) {
    uVar18 = uVar16;
  }
  uVar14 = uVar18 & 0xfffffffc;
  iVar12 = (int)uVar16 % 4;
  iVar9 = *(int *)(&DAT_0015e9e0 + (long)((int)uVar18 >> 2) * 4);
  core->refi[0] = -1;
  core->refi[1] = -1;
  if ((char)((byte)local_82 | local_82._1_1_) < '\0') {
    if (-1 < (char)(byte)local_82) {
      if ((uVar16 == uVar14) || ((iVar5 = 0, iVar12 != 2 && (iVar9 = -iVar9, iVar12 == 1)))) {
        iVar5 = iVar9;
        iVar9 = 0;
      }
      iVar9 = local_80[1] + iVar9;
      iVar12 = local_80[0] + iVar5;
      if (0x7ffe < local_80[0] + iVar5) {
        iVar12 = 0x7fff;
      }
      sVar11 = (s16)iVar12;
      if (iVar12 < -0x7fff) {
        sVar11 = -0x8000;
      }
      core->mv[0][0] = sVar11;
      if (0x7ffe < iVar9) {
        iVar9 = 0x7fff;
      }
      sVar11 = (s16)iVar9;
      if (iVar9 < -0x7fff) {
        sVar11 = -0x8000;
      }
      core->mv[0][1] = sVar11;
      core->refi[0] = (byte)local_82;
      return;
    }
    if (local_82 < 0) {
      return;
    }
    if ((uVar16 == uVar14) || ((iVar5 = 0, iVar12 != 2 && (iVar9 = -iVar9, iVar12 == 1)))) {
      iVar5 = iVar9;
      iVar9 = 0;
    }
    iVar9 = local_7c[1] + iVar9;
    iVar12 = local_7c[0] + iVar5;
    if (0x7ffe < local_7c[0] + iVar5) {
      iVar12 = 0x7fff;
    }
    sVar11 = (s16)iVar12;
    if (iVar12 < -0x7fff) {
      sVar11 = -0x8000;
    }
    core->mv[1][0] = sVar11;
    if (0x7ffe < iVar9) {
      iVar9 = 0x7fff;
    }
    sVar11 = (s16)iVar9;
    if (iVar9 < -0x7fff) {
      sVar11 = -0x8000;
    }
    core->mv[1][1] = sVar11;
    goto LAB_0010a3aa;
  }
  iVar5 = (int)core->refp[(byte)local_82][0].dist;
  uVar8 = iVar5 * 2;
  iVar7 = (int)core->refp[local_82._1_1_][1].dist;
  uVar4 = iVar7 * 2;
  uVar18 = iVar7 * -2;
  if ((int)uVar18 < 0) {
    uVar18 = uVar4;
  }
  uVar17 = iVar5 * -2;
  if ((int)uVar17 < 0) {
    uVar17 = uVar8;
  }
  uVar8 = (int)(uVar4 * uVar8) >> 0x1f | 1;
  if (uVar18 < uVar17) {
    iVar7 = 0x4000;
    iVar5 = (int)(0x4000 / (ulong)uVar17) * uVar18;
    uVar18 = uVar8;
    uVar8 = 1;
  }
  else {
    iVar5 = 0x4000;
    iVar7 = (int)(0x4000 / (ulong)uVar18) * uVar17;
    uVar18 = 1;
  }
  iVar7 = (iVar7 * iVar9 + 0x2000 >> 0xe) * uVar8;
  if (0x7ffe < iVar7) {
    iVar7 = 0x7fff;
  }
  if (iVar7 < -0x7fff) {
    iVar7 = -0x8000;
  }
  iVar9 = (iVar5 * iVar9 + 0x2000 >> 0xe) * uVar18;
  if (0x7ffe < iVar9) {
    iVar9 = 0x7fff;
  }
  if (iVar9 < -0x7fff) {
    iVar9 = -0x8000;
  }
  if (uVar16 == uVar14) {
LAB_0010a2fc:
    iVar15 = iVar7;
    iVar7 = 0;
    iVar5 = 0;
  }
  else {
    iVar15 = 0;
    iVar5 = iVar9;
    if (iVar12 != 2) {
      iVar7 = -iVar7;
      iVar9 = -iVar9;
      iVar5 = iVar9;
      if (iVar12 == 1) goto LAB_0010a2fc;
    }
    iVar9 = 0;
  }
  iVar15 = local_80[0] + iVar15;
  iVar7 = local_80[1] + iVar7;
  if (0x7ffe < iVar15) {
    iVar15 = 0x7fff;
  }
  sVar11 = (s16)iVar15;
  if (iVar15 < -0x7fff) {
    sVar11 = -0x8000;
  }
  core->mv[0][0] = sVar11;
  if (0x7ffe < iVar7) {
    iVar7 = 0x7fff;
  }
  sVar11 = (s16)iVar7;
  if (iVar7 < -0x7fff) {
    sVar11 = -0x8000;
  }
  core->mv[0][1] = sVar11;
  core->refi[0] = (byte)local_82;
  iVar9 = local_7c[0] + iVar9;
  iVar5 = local_7c[1] + iVar5;
  if (0x7ffe < iVar9) {
    iVar9 = 0x7fff;
  }
  sVar11 = (s16)iVar9;
  if (iVar9 < -0x7fff) {
    sVar11 = -0x8000;
  }
  core->mv[1][0] = sVar11;
  if (0x7ffe < iVar5) {
    iVar5 = 0x7fff;
  }
  sVar11 = (s16)iVar5;
  if (iVar5 < -0x7fff) {
    sVar11 = -0x8000;
  }
  core->mv[1][1] = sVar11;
LAB_0010a3aa:
  core->refi[1] = local_82._1_1_;
  return;
}

Assistant:

void dec_derive_skip_mv_umve(com_core_t * core, int umve_idx)
{
    s16 pmv_base_cands[REFP_NUM][MV_D];
    s8  refi_base_cands[REFP_NUM];
    int base_idx = umve_idx / UMVE_MAX_REFINE_NUM;

    if (derive_umve_base_motions(core, base_idx, pmv_base_cands, refi_base_cands)) {
        derive_temporal_motions(core, pmv_base_cands, refi_base_cands);
    } 
    derive_umve_final_motions(core, umve_idx, pmv_base_cands, refi_base_cands);
}